

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_dimension_set_mask_bits
                   (PS_Dimension dim,FT_Byte *source,FT_UInt source_pos,FT_UInt source_bits,
                   FT_UInt end_point,FT_Memory memory)

{
  PS_Mask_TableRec *table;
  PS_Mask pPVar1;
  FT_Error FVar2;
  PS_Mask in_RAX;
  ulong uVar3;
  byte bVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  PS_Mask mask;
  PS_Mask local_38;
  uint uVar7;
  
  table = &dim->masks;
  uVar3 = (ulong)(dim->masks).num_masks;
  if (uVar3 != 0) {
    (dim->masks).masks[uVar3 - 1].end_point = end_point;
  }
  local_38 = in_RAX;
  FVar2 = ps_mask_table_alloc(table,memory,&local_38);
  if (FVar2 == 0) {
    if ((ulong)table->num_masks == 0) {
      FVar2 = ps_mask_table_alloc(table,memory,&local_38);
    }
    else {
      local_38 = (dim->masks).masks + ((ulong)table->num_masks - 1);
      FVar2 = 0;
    }
    pPVar1 = local_38;
    if (FVar2 == 0) {
      FVar2 = ps_mask_ensure(local_38,source_bits,memory);
      if (FVar2 == 0) {
        pPVar1->num_bits = source_bits;
        FVar2 = 0;
        if (source_bits != 0) {
          pbVar5 = pPVar1->bytes;
          pbVar10 = source + (source_pos >> 3);
          uVar7 = 0x80;
          uVar8 = 0x80 >> ((byte)source_pos & 7);
          do {
            uVar6 = (int)uVar7 >> 1;
            if (uVar7 < 2) {
              uVar6 = 0x80;
            }
            uVar9 = uVar8 >> 1;
            if (uVar8 < 2) {
              uVar9 = 0x80;
            }
            bVar4 = (byte)uVar7 | *pbVar5;
            if ((uVar8 & *pbVar10) == 0) {
              bVar4 = ~(byte)uVar7 & *pbVar5;
            }
            *pbVar5 = bVar4;
            source_bits = source_bits - 1;
            pbVar5 = pbVar5 + (uVar7 < 2);
            pbVar10 = pbVar10 + (uVar8 < 2);
            FVar2 = 0;
            uVar7 = uVar6;
            uVar8 = uVar9;
          } while (source_bits != 0);
        }
      }
    }
  }
  return FVar2;
}

Assistant:

static FT_Error
  ps_dimension_set_mask_bits( PS_Dimension    dim,
                              const FT_Byte*  source,
                              FT_UInt         source_pos,
                              FT_UInt         source_bits,
                              FT_UInt         end_point,
                              FT_Memory       memory )
  {
    FT_Error  error;


    /* reset current mask, if any */
    error = ps_dimension_reset_mask( dim, end_point, memory );
    if ( error )
      goto Exit;

    /* set bits in new mask */
    error = ps_mask_table_set_bits( &dim->masks, source,
                                    source_pos, source_bits, memory );

  Exit:
    return error;
  }